

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gnode_pos.c
# Opt level: O0

mpt_node * mpt_gnode_pos(mpt_node *node,int pos)

{
  int *piVar1;
  int local_1c;
  mpt_node *pmStack_18;
  int pos_local;
  mpt_node *node_local;
  
  if (node == (mpt_node *)0x0) {
    piVar1 = __errno_location();
    *piVar1 = 0xe;
    node_local = (mpt_node *)0x0;
  }
  else {
    local_1c = pos;
    pmStack_18 = node;
    if (pos < 0) {
      for (; local_1c != 0 && pmStack_18 != (mpt_node *)0x0; pmStack_18 = pmStack_18->prev) {
        local_1c = local_1c + 1;
      }
    }
    else if (pos == 0) {
      for (; pmStack_18->next != (mpt_node *)0x0; pmStack_18 = pmStack_18->next) {
      }
    }
    else {
      for (; local_1c = local_1c + -1, local_1c != 0 && pmStack_18 != (mpt_node *)0x0;
          pmStack_18 = pmStack_18->next) {
      }
    }
    node_local = pmStack_18;
  }
  return node_local;
}

Assistant:

extern MPT_STRUCT(node) *mpt_gnode_pos(const MPT_STRUCT(node) *node, int pos)
{
	if (!node) {
		errno = EFAULT;
		return 0;
	}
	/* get nth predecessor of node */
	if (pos < 0) {
		while (pos++ && node) {
			node = node->prev;
		}
	}
	/* get nth position starting with node */
	else if (pos) {
		while (--pos && node) {
			node = node->next;
		}
	}
	/* pos == 0 -> get last node */
	else {
		while (node->next) {
			node = node->next;
		}
	}
	
	return (MPT_STRUCT(node) *) node;
}